

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O0

Fl_Widget * __thiscall Fl_Tree_Type::widget(Fl_Tree_Type *this,int x,int y,int w,int h)

{
  Fl_Tree *this_00;
  Fl_Tree *b;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  Fl_Tree_Type *this_local;
  
  this_00 = (Fl_Tree *)operator_new(0x130);
  Fl_Tree::Fl_Tree(this_00,x,y,w,h,(char *)0x0);
  if (batch_mode == 0) {
    Fl_Tree::add(this_00,"/A1/B1/C1");
    Fl_Tree::add(this_00,"/A1/B1/C2");
    Fl_Tree::add(this_00,"/A1/B2/C1");
    Fl_Tree::add(this_00,"/A1/B2/C2");
    Fl_Tree::add(this_00,"/A2/B1/C1");
    Fl_Tree::add(this_00,"/A2/B1/C2");
    Fl_Tree::add(this_00,"/A2/B2/C1");
    Fl_Tree::add(this_00,"/A2/B2/C2");
  }
  return (Fl_Widget *)this_00;
}

Assistant:

Fl_Widget *widget(int x,int y,int w,int h) {
    Fl_Tree* b = new Fl_Tree(x,y,w,h);
    if (!batch_mode) {
      b->add("/A1/B1/C1");
      b->add("/A1/B1/C2");
      b->add("/A1/B2/C1");
      b->add("/A1/B2/C2");
      b->add("/A2/B1/C1");
      b->add("/A2/B1/C2");
      b->add("/A2/B2/C1");
      b->add("/A2/B2/C2");
    }
    return b;
  }